

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O0

char * printable(char *inbuf,size_t inlength)

{
  char *pcVar1;
  ulong local_60;
  ulong local_58;
  size_t o;
  size_t i;
  size_t outincr;
  size_t outsize;
  size_t newsize;
  char *newbuf;
  char *outbuf;
  size_t inlength_local;
  char *inbuf_local;
  
  i = 0;
  local_58 = 0;
  outbuf = (char *)inlength;
  if (inlength == 0) {
    outbuf = (char *)strlen(inbuf);
  }
  if (outbuf == (char *)0x0) {
    outincr = 10;
  }
  else {
    if ((ulong)outbuf >> 1 < 7) {
      local_60 = 7;
    }
    else {
      local_60 = (ulong)outbuf >> 1;
    }
    i = local_60;
    outincr = (size_t)(outbuf + local_60);
  }
  newbuf = (char *)malloc(outincr);
  if (newbuf == (char *)0x0) {
    inbuf_local = (char *)0x0;
  }
  else if (outbuf == (char *)0x0) {
    curl_msnprintf(newbuf,outincr,"%s","[NOTHING]");
    inbuf_local = newbuf;
  }
  else {
    for (o = 0; o < outbuf; o = o + 1) {
      pcVar1 = newbuf;
      if (outincr - 7 < local_58) {
        outincr = outincr + i;
        pcVar1 = (char *)realloc(newbuf,outincr);
        if (pcVar1 == (char *)0x0) {
          free(newbuf);
          return (char *)0x0;
        }
      }
      newbuf = pcVar1;
      if ((inbuf[o] < '!') || ('~' < inbuf[o])) {
        curl_msnprintf(newbuf + local_58,outincr - local_58,"[0x%02X]",(ulong)(uint)(int)inbuf[o]);
        local_58 = local_58 + 6;
      }
      else {
        newbuf[local_58] = inbuf[o];
        local_58 = local_58 + 1;
      }
    }
    newbuf[local_58] = '\0';
    inbuf_local = newbuf;
  }
  return inbuf_local;
}

Assistant:

static char *printable(char *inbuf, size_t inlength)
{
  char *outbuf;
  char *newbuf;
  size_t newsize;
  size_t outsize;
  size_t outincr = 0;
  size_t i, o = 0;

#define HEX_FMT_STR  "[0x%02X]"
#define HEX_STR_LEN  6
#define NOTHING_STR  "[NOTHING]"
#define NOTHING_LEN  9

  if(!inlength)
    inlength = strlen(inbuf);

  if(inlength) {
    outincr = ((inlength/2) < (HEX_STR_LEN+1)) ? HEX_STR_LEN+1 : inlength/2;
    outsize = inlength + outincr;
  }
  else
    outsize = NOTHING_LEN + 1;

  outbuf = malloc(outsize);
  if(!outbuf)
    return NULL;

  if(!inlength) {
    snprintf(&outbuf[0], outsize, "%s", NOTHING_STR);
    return outbuf;
  }

  for(i=0; i<inlength; i++) {

    if(o > outsize - (HEX_STR_LEN + 1)) {
      newsize = outsize + outincr;
      newbuf = realloc(outbuf, newsize);
      if(!newbuf) {
        free(outbuf);
        return NULL;
      }
      outbuf = newbuf;
      outsize = newsize;
    }

    if((inbuf[i] > 0x20) && (inbuf[i] < 0x7F)) {
      outbuf[o] = inbuf[i];
      o++;
    }
    else {
      snprintf(&outbuf[o], outsize - o, HEX_FMT_STR, inbuf[i]);
      o += HEX_STR_LEN;
    }

  }
  outbuf[o] = '\0';

  return outbuf;
}